

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall kj::anon_unknown_31::HttpOutputStream::flush(HttpOutputStream *this)

{
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar1;
  ForkedPromise<void> local_38;
  undefined1 local_28 [8];
  ForkedPromise<void> fork;
  HttpOutputStream *this_local;
  
  Promise<void>::fork((Promise<void> *)local_28);
  ForkedPromise<void>::addBranch(&local_38);
  Promise<void>::operator=((Promise<void> *)(in_RSI + 8),(Promise<void> *)&local_38);
  Promise<void>::~Promise((Promise<void> *)&local_38);
  ForkedPromise<void>::addBranch((ForkedPromise<void> *)this);
  ForkedPromise<void>::~ForkedPromise((ForkedPromise<void> *)local_28);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> flush() {
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();
    return fork.addBranch();
  }